

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void __thiscall
duckdb::AggregateExecutor::
UnaryScatter<duckdb::IntervalAvgState,duckdb::interval_t,duckdb::IntervalAverageOperation>
          (AggregateExecutor *this,Vector *input,Vector *states,AggregateInputData *aggr_input_data,
          idx_t count)

{
  undefined8 *puVar1;
  IntervalAdd *this_00;
  interval_t *idata_00;
  IntervalAvgState **states_00;
  interval_t input_00;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat local_b8;
  UnifiedVectorFormat local_70;
  
  if ((*this == (AggregateExecutor)0x2) && (input->vector_type == CONSTANT_VECTOR)) {
    if ((*(byte **)(this + 0x28) == (byte *)0x0) || ((**(byte **)(this + 0x28) & 1) != 0)) {
      puVar1 = *(undefined8 **)(this + 0x20);
      this_00 = *(IntervalAdd **)input->data;
      *(long *)this_00 = (long)&(aggr_input_data->bind_data).ptr + *(long *)this_00;
      input_00.micros = (int64_t)aggr_input_data;
      input_00._0_8_ = puVar1[1];
      IntervalAdd::AddConstant<duckdb::IntervalAvgState,duckdb::interval_t>
                (this_00,(IntervalAvgState *)*puVar1,input_00,count);
      return;
    }
  }
  else {
    if (*this == (AggregateExecutor)0x0 && input->vector_type == FLAT_VECTOR) {
      idata_00 = *(interval_t **)(this + 0x20);
      states_00 = (IntervalAvgState **)input->data;
      FlatVector::VerifyFlatVector((Vector *)this);
      UnaryFlatLoop<duckdb::IntervalAvgState,duckdb::interval_t,duckdb::IntervalAverageOperation>
                (idata_00,(AggregateInputData *)states,states_00,(ValidityMask *)(this + 0x28),
                 (idx_t)aggr_input_data);
      return;
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&local_70);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_b8);
    Vector::ToUnifiedFormat((Vector *)this,(idx_t)aggr_input_data,&local_70);
    Vector::ToUnifiedFormat(input,(idx_t)aggr_input_data,&local_b8);
    UnaryScatterLoop<duckdb::IntervalAvgState,duckdb::interval_t,duckdb::IntervalAverageOperation>
              ((interval_t *)local_70.data,(AggregateInputData *)states,
               (IntervalAvgState **)local_b8.data,local_70.sel,local_b8.sel,&local_70.validity,
               (idx_t)aggr_input_data);
    if (local_b8.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b8.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_70.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}